

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O3

int arkStep_SetButcherTables(ARKodeMem ark_mem)

{
  void *pvVar1;
  undefined8 *puVar2;
  uint uVar3;
  undefined8 in_RAX;
  ARKodeButcherTable pAVar4;
  ARKODE_DIRKTableID imethod;
  ARKODE_ERKTableID AVar5;
  sunindextype Bliw;
  sunindextype Blrw;
  undefined8 local_38;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::ARKStep","arkStep_SetButcherTables",
                    "Time step module memory is NULL.");
    return -0x15;
  }
  if (*(long *)((long)pvVar1 + 0x60) != 0) {
    return 0;
  }
  if (*(long *)((long)pvVar1 + 0x68) != 0) {
    return 0;
  }
  local_38 = in_RAX;
  if (*(int *)((long)pvVar1 + 0x18) == 0) {
    if (*(int *)((long)pvVar1 + 0x1c) != 0) {
      uVar3 = *(int *)((long)pvVar1 + 0x50) - 2;
      if (uVar3 < 4) {
        imethod = *(ARKODE_DIRKTableID *)(&DAT_0066b840 + (ulong)uVar3 * 4);
      }
      else {
        arkProcessError(ark_mem,-0x16,"ARKode::ARKStep","arkStep_SetButcherTables",
                        "No implicit method at requested order, using q=5.");
        imethod = ARKODE_ARK548L2SA_DIRK_8_4_5;
      }
      goto LAB_003cf630;
    }
  }
  else if (*(int *)((long)pvVar1 + 0x1c) != 0) {
    uVar3 = *(int *)((long)pvVar1 + 0x50) - 2;
    if (uVar3 < 4) {
      AVar5 = *(ARKODE_ERKTableID *)(&DAT_0066b820 + (ulong)uVar3 * 4);
      imethod = *(ARKODE_DIRKTableID *)(&DAT_0066b830 + (ulong)uVar3 * 4);
    }
    else {
      arkProcessError(ark_mem,-0x16,"ARKode::ARKStep","arkStep_SetButcherTables",
                      "No ImEx method at requested order, using q=5.");
      imethod = ARKODE_ARK548L2SA_DIRK_8_4_5;
      AVar5 = ARKODE_ARK548L2SA_ERK_8_4_5;
    }
    pAVar4 = ARKodeButcherTable_LoadERK(AVar5);
    *(ARKodeButcherTable *)((long)pvVar1 + 0x60) = pAVar4;
LAB_003cf630:
    pAVar4 = ARKodeButcherTable_LoadDIRK(imethod);
    *(ARKodeButcherTable *)((long)pvVar1 + 0x68) = pAVar4;
    pAVar4 = *(ARKodeButcherTable *)((long)pvVar1 + 0x60);
    goto LAB_003cf63f;
  }
  uVar3 = *(int *)((long)pvVar1 + 0x50) - 2;
  if (uVar3 < 7) {
    AVar5 = *(ARKODE_ERKTableID *)(&DAT_0066b874 + (ulong)uVar3 * 4);
  }
  else {
    arkProcessError(ark_mem,-0x16,"ARKode::ARKStep","arkStep_SetButcherTables",
                    "No explicit method at requested order, using q=6.");
    AVar5 = ARKODE_VERNER_8_5_6;
  }
  pAVar4 = ARKodeButcherTable_LoadERK(AVar5);
  *(ARKodeButcherTable *)((long)pvVar1 + 0x60) = pAVar4;
LAB_003cf63f:
  ARKodeButcherTable_Space(pAVar4,(sunindextype *)&local_38,(sunindextype *)((long)&local_38 + 4));
  ark_mem->liw = ark_mem->liw + (long)(int)local_38;
  ark_mem->lrw = ark_mem->lrw + (long)local_38._4_4_;
  ARKodeButcherTable_Space
            (*(ARKodeButcherTable *)((long)pvVar1 + 0x68),(sunindextype *)&local_38,
             (sunindextype *)((long)&local_38 + 4));
  ark_mem->liw = ark_mem->liw + (long)(int)local_38;
  ark_mem->lrw = ark_mem->lrw + (long)local_38._4_4_;
  puVar2 = *(undefined8 **)((long)pvVar1 + 0x60);
  if (puVar2 != (undefined8 *)0x0) {
    *(undefined4 *)((long)pvVar1 + 0x5c) = *(undefined4 *)(puVar2 + 1);
    *(undefined8 *)((long)pvVar1 + 0x50) = *puVar2;
  }
  puVar2 = *(undefined8 **)((long)pvVar1 + 0x68);
  if (puVar2 != (undefined8 *)0x0) {
    *(undefined4 *)((long)pvVar1 + 0x5c) = *(undefined4 *)(puVar2 + 1);
    *(undefined8 *)((long)pvVar1 + 0x50) = *puVar2;
  }
  return 0;
}

Assistant:

int arkStep_SetButcherTables(ARKodeMem ark_mem)
{
  int etable, itable;
  ARKodeARKStepMem step_mem;
  sunindextype Blrw, Bliw;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::ARKStep",
                    "arkStep_SetButcherTables", MSG_ARKSTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem) ark_mem->step_mem;

  /* if tables have already been specified, just return */
  if ( (step_mem->Be != NULL) || (step_mem->Bi != NULL) )
    return(ARK_SUCCESS);

  /* initialize table numbers to illegal values */
  etable = itable = -1;

  /**** ImEx methods ****/
  if (step_mem->explicit && step_mem->implicit) {

    switch (step_mem->q) {

    case(2):
    case(3):
      etable = ARKSTEP_DEFAULT_ARK_ETABLE_3;
      itable = ARKSTEP_DEFAULT_ARK_ITABLE_3;
      break;
    case(4):
      etable = ARKSTEP_DEFAULT_ARK_ETABLE_4;
      itable = ARKSTEP_DEFAULT_ARK_ITABLE_4;
      break;
    case(5):
      etable = ARKSTEP_DEFAULT_ARK_ETABLE_5;
      itable = ARKSTEP_DEFAULT_ARK_ITABLE_5;
      break;
    default:    /* no available method, set default */
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "arkStep_SetButcherTables",
                      "No ImEx method at requested order, using q=5.");
      etable = ARKSTEP_DEFAULT_ARK_ETABLE_5;
      itable = ARKSTEP_DEFAULT_ARK_ITABLE_5;
      break;
    }

  /**** implicit methods ****/
  } else if (step_mem->implicit) {

    switch (step_mem->q) {
    case(2):
      itable = ARKSTEP_DEFAULT_DIRK_2;
      break;
    case(3):
      itable = ARKSTEP_DEFAULT_DIRK_3;
      break;
    case(4):
      itable = ARKSTEP_DEFAULT_DIRK_4;
      break;
    case(5):
      itable = ARKSTEP_DEFAULT_DIRK_5;
      break;
    default:    /* no available method, set default */
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "arkStep_SetButcherTables",
                      "No implicit method at requested order, using q=5.");
      itable = ARKSTEP_DEFAULT_DIRK_5;
      break;
    }

  /**** explicit methods ****/
  } else {

    switch (step_mem->q) {
    case(2):
      etable = ARKSTEP_DEFAULT_ERK_2;
      break;
    case(3):
      etable = ARKSTEP_DEFAULT_ERK_3;
      break;
    case(4):
      etable = ARKSTEP_DEFAULT_ERK_4;
      break;
    case(5):
      etable = ARKSTEP_DEFAULT_ERK_5;
      break;
    case(6):
      etable = ARKSTEP_DEFAULT_ERK_6;
      break;
    case(7):
    case(8):
      etable = ARKSTEP_DEFAULT_ERK_8;
      break;
    default:    /* no available method, set default */
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "arkStep_SetButcherTables",
                      "No explicit method at requested order, using q=6.");
      etable = ARKSTEP_DEFAULT_ERK_6;
      break;
    }

  }

  if (etable > -1)
    step_mem->Be = ARKodeButcherTable_LoadERK(etable);
  if (itable > -1)
    step_mem->Bi = ARKodeButcherTable_LoadDIRK(itable);

  /* note Butcher table space requirements */
  ARKodeButcherTable_Space(step_mem->Be, &Bliw, &Blrw);
  ark_mem->liw += Bliw;
  ark_mem->lrw += Blrw;

  ARKodeButcherTable_Space(step_mem->Bi, &Bliw, &Blrw);
  ark_mem->liw += Bliw;
  ark_mem->lrw += Blrw;

  /* set [redundant] ARK stored values for stage numbers and method orders */
  if (step_mem->Be != NULL) {
    step_mem->stages = step_mem->Be->stages;
    step_mem->q = step_mem->Be->q;
    step_mem->p = step_mem->Be->p;
  }
  if (step_mem->Bi != NULL) {
    step_mem->stages = step_mem->Bi->stages;
    step_mem->q = step_mem->Bi->q;
    step_mem->p = step_mem->Bi->p;
  }

  return(ARK_SUCCESS);
}